

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debug_info_manager.cpp
# Opt level: O1

bool __thiscall
spvtools::opt::analysis::DebugInfoManager::IsDeclareVisibleToInstr
          (DebugInfoManager *this,Instruction *dbg_declare,Instruction *scope)

{
  IRContext *this_00;
  DefUseManager *this_01;
  ulong uVar1;
  pointer puVar2;
  uint32_t ancestor_scope_itr;
  uint32_t uVar3;
  uint32_t child_scope;
  Instruction *pIVar4;
  _Hash_node_base *p_Var5;
  ulong uVar6;
  uint uVar7;
  __node_base_ptr p_Var8;
  __node_base_ptr p_Var9;
  uint uVar10;
  uint32_t *puVar11;
  vector<unsigned_int,_std::allocator<unsigned_int>_> scope_ids;
  uint32_t local_4c;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_48;
  
  if (dbg_declare == (Instruction *)0x0) {
    __assert_fail("dbg_declare != nullptr",
                  "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/debug_info_manager.cpp"
                  ,0x20f,
                  "bool spvtools::opt::analysis::DebugInfoManager::IsDeclareVisibleToInstr(Instruction *, Instruction *)"
                 );
  }
  if (scope == (Instruction *)0x0) {
    __assert_fail("scope != nullptr",
                  "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/debug_info_manager.cpp"
                  ,0x210,
                  "bool spvtools::opt::analysis::DebugInfoManager::IsDeclareVisibleToInstr(Instruction *, Instruction *)"
                 );
  }
  local_48.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (uint32_t *)0x0;
  local_48.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (uint32_t *)0x0;
  local_48.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (uint *)0x0;
  if (scope->opcode_ == OpPhi) {
    local_4c = (scope->dbg_scope_).lexical_scope_;
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_realloc_insert<unsigned_int>
              (&local_48,(iterator)0x0,&local_4c);
    uVar10 = (scope->has_result_id_ & 1) + 1;
    if (scope->has_type_id_ == false) {
      uVar10 = (uint)scope->has_result_id_;
    }
    if (uVar10 != (int)((ulong)((long)(scope->operands_).
                                      super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                                      ._M_impl.super__Vector_impl_data._M_finish -
                               (long)(scope->operands_).
                                     super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                                     ._M_impl.super__Vector_impl_data._M_start) >> 4) * -0x55555555)
    {
      uVar10 = 0;
      do {
        this_00 = this->context_;
        if ((this_00->valid_analyses_ & kAnalysisBegin) == kAnalysisNone) {
          IRContext::BuildDefUseManager(this_00);
        }
        this_01 = (this_00->def_use_mgr_)._M_t.
                  super___uniq_ptr_impl<spvtools::opt::analysis::DefUseManager,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_spvtools::opt::analysis::DefUseManager_*,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
                  .super__Head_base<0UL,_spvtools::opt::analysis::DefUseManager_*,_false>.
                  _M_head_impl;
        uVar7 = (scope->has_result_id_ & 1) + 1;
        if (scope->has_type_id_ == false) {
          uVar7 = (uint)scope->has_result_id_;
        }
        uVar3 = Instruction::GetSingleWordOperand(scope,uVar7 + uVar10);
        pIVar4 = DefUseManager::GetDef(this_01,uVar3);
        if (pIVar4 != (Instruction *)0x0) {
          local_4c = (pIVar4->dbg_scope_).lexical_scope_;
          if (local_48.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_finish ==
              local_48.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            std::vector<unsigned_int,_std::allocator<unsigned_int>_>::
            _M_realloc_insert<unsigned_int>
                      (&local_48,
                       (iterator)
                       local_48.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                       _M_impl.super__Vector_impl_data._M_finish,&local_4c);
          }
          else {
            *local_48.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_finish = local_4c;
            local_48.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_finish =
                 local_48.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_finish + 1;
          }
        }
        uVar10 = uVar10 + 2;
        uVar7 = (scope->has_result_id_ & 1) + 1;
        if (scope->has_type_id_ == false) {
          uVar7 = (uint)scope->has_result_id_;
        }
      } while (uVar10 < (int)((ulong)((long)(scope->operands_).
                                            super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                                            ._M_impl.super__Vector_impl_data._M_finish -
                                     (long)(scope->operands_).
                                           super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                                           ._M_impl.super__Vector_impl_data._M_start) >> 4) *
                        -0x55555555 - uVar7);
    }
  }
  else {
    local_4c = (scope->dbg_scope_).lexical_scope_;
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_realloc_insert<unsigned_int>
              (&local_48,(iterator)0x0,&local_4c);
  }
  uVar3 = Instruction::GetSingleWordOperand(dbg_declare,4);
  uVar1 = (this->id_to_dbg_inst_)._M_h._M_bucket_count;
  uVar6 = (ulong)uVar3 % uVar1;
  p_Var8 = (this->id_to_dbg_inst_)._M_h._M_buckets[uVar6];
  p_Var9 = (__node_base_ptr)0x0;
  if ((p_Var8 != (__node_base_ptr)0x0) &&
     (p_Var5 = p_Var8->_M_nxt, p_Var9 = p_Var8, uVar3 != *(uint32_t *)&p_Var8->_M_nxt[1]._M_nxt)) {
    while (p_Var8 = p_Var5, p_Var5 = p_Var8->_M_nxt, p_Var5 != (_Hash_node_base *)0x0) {
      p_Var9 = (__node_base_ptr)0x0;
      if (((ulong)*(uint *)&p_Var5[1]._M_nxt % uVar1 != uVar6) ||
         (p_Var9 = p_Var8, uVar3 == *(uint *)&p_Var5[1]._M_nxt)) goto LAB_0059c50c;
    }
    p_Var9 = (__node_base_ptr)0x0;
  }
LAB_0059c50c:
  if (p_Var9 == (__node_base_ptr)0x0) {
    p_Var5 = (_Hash_node_base *)0x0;
  }
  else {
    p_Var5 = p_Var9->_M_nxt;
  }
  if (p_Var5 == (_Hash_node_base *)0x0) {
    __assert_fail("dbg_local_var_itr != id_to_dbg_inst_.end()",
                  "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/debug_info_manager.cpp"
                  ,0x222,
                  "bool spvtools::opt::analysis::DebugInfoManager::IsDeclareVisibleToInstr(Instruction *, Instruction *)"
                 );
  }
  uVar3 = Instruction::GetSingleWordOperand((Instruction *)p_Var5[2]._M_nxt,9);
  puVar2 = local_48.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_finish;
  for (puVar11 = local_48.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_start; puVar11 != puVar2; puVar11 = puVar11 + 1) {
    child_scope = *puVar11;
    if (child_scope != 0) {
      if (child_scope == uVar3) break;
      do {
        child_scope = GetParentScope(this,child_scope);
        if (child_scope == uVar3) break;
      } while (child_scope != 0);
      if (child_scope != 0) break;
    }
  }
  if (local_48.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (uint32_t *)0x0) {
    operator_delete(local_48.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                    .super__Vector_impl_data._M_start,
                    (long)local_48.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_48.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  return puVar11 != puVar2;
}

Assistant:

bool DebugInfoManager::IsDeclareVisibleToInstr(Instruction* dbg_declare,
                                               Instruction* scope) {
  assert(dbg_declare != nullptr);
  assert(scope != nullptr);

  std::vector<uint32_t> scope_ids;
  if (scope->opcode() == spv::Op::OpPhi) {
    scope_ids.push_back(scope->GetDebugScope().GetLexicalScope());
    for (uint32_t i = 0; i < scope->NumInOperands(); i += 2) {
      auto* value = context()->get_def_use_mgr()->GetDef(
          scope->GetSingleWordInOperand(i));
      if (value != nullptr)
        scope_ids.push_back(value->GetDebugScope().GetLexicalScope());
    }
  } else {
    scope_ids.push_back(scope->GetDebugScope().GetLexicalScope());
  }

  uint32_t dbg_local_var_id =
      dbg_declare->GetSingleWordOperand(kDebugDeclareOperandLocalVariableIndex);
  auto dbg_local_var_itr = id_to_dbg_inst_.find(dbg_local_var_id);
  assert(dbg_local_var_itr != id_to_dbg_inst_.end());
  uint32_t decl_scope_id = dbg_local_var_itr->second->GetSingleWordOperand(
      kDebugLocalVariableOperandParentIndex);

  // If the scope of DebugDeclare is an ancestor scope of the instruction's
  // scope, the local variable is visible to the instruction.
  for (uint32_t scope_id : scope_ids) {
    if (scope_id != kNoDebugScope &&
        IsAncestorOfScope(scope_id, decl_scope_id)) {
      return true;
    }
  }
  return false;
}